

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObservationHistory.h
# Opt level: O0

void __thiscall ObservationHistory::Print(ObservationHistory *this)

{
  ObservationHistory *in_stack_000001c8;
  string local_28 [40];
  
  SoftPrint_abi_cxx11_(in_stack_000001c8);
  std::operator<<((ostream *)&std::cout,local_28);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void Print() const
        { std::cout << SoftPrint();}